

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O1

avl_node * avl_search(avl_tree *tree,avl_node *node,avl_cmp_func *func)

{
  avl_node *paVar1;
  int iVar2;
  long lVar3;
  
  paVar1 = tree->root;
  while( true ) {
    if (paVar1 == (avl_node *)0x0) {
      return (avl_node *)0x0;
    }
    iVar2 = (*func)(paVar1,node,tree->aux);
    lVar3 = 8;
    if ((iVar2 < 1) && (lVar3 = 0x10, -1 < iVar2)) break;
    paVar1 = *(avl_node **)((long)&paVar1->parent + lVar3);
  }
  return paVar1;
}

Assistant:

struct avl_node* avl_search(struct avl_tree *tree,
                            struct avl_node *node,
                            avl_cmp_func *func)
// exact match
{
    struct avl_node *p = tree->root;
    int cmp;

    while(p)
    {
        cmp = func(p, node, tree->aux);
        if (cmp > 0) {
            p = p->left;
        }else if (cmp < 0){
            p = p->right;
        }else {
            // search success
            return p;
        }
    }
    // search fail
    return NULL;
}